

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

char_t * __thiscall
pugi::impl::anon_unknown_0::xpath_string::data(xpath_string *this,xpath_allocator *alloc)

{
  char_t *__src;
  size_t __n;
  char_t *__dest;
  
  if (this->_uses_heap == false) {
    __n = strlength(this->_buffer);
    __src = this->_buffer;
    __dest = (char_t *)xpath_allocator::allocate(alloc,__n + 1);
    if (__dest == (char_t *)0x0) {
      __dest = (char_t *)0x0;
    }
    else {
      memcpy(__dest,__src,__n);
      __dest[__n] = '\0';
    }
    if (__dest == (char_t *)0x0) {
      return (char_t *)0x0;
    }
    this->_buffer = __dest;
    this->_uses_heap = true;
    this->_length_heap = __n;
  }
  return this->_buffer;
}

Assistant:

char_t* data(xpath_allocator* alloc)
		{
			// make private heap copy
			if (!_uses_heap)
			{
				size_t length_ = strlength(_buffer);
				const char_t* data_ = duplicate_string(_buffer, length_, alloc);

				if (!data_) return 0;

				_buffer = data_;
				_uses_heap = true;
				_length_heap = length_;
			}

			return const_cast<char_t*>(_buffer);
		}